

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O3

WORD32 ihevcd_free_static_bufs(iv_obj_t *ps_codec_obj)

{
  void *pvVar1;
  code *pcVar2;
  undefined8 uVar3;
  
  pvVar1 = ps_codec_obj->pv_codec_handle;
  pcVar2 = *(code **)((long)pvVar1 + 0x3f50);
  uVar3 = *(undefined8 *)((long)pvVar1 + 0x3f58);
  if (*(long *)((long)pvVar1 + 0x3ea0) != 0) {
    (*pcVar2)(uVar3);
    *(undefined8 *)((long)pvVar1 + 0x3ea0) = 0;
  }
  if (*(long *)((long)pvVar1 + 0xb8) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0xb8) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x160) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x160) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x178) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x178) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x138) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x138) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x118) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x118) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x198) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x198) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x1a0) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x1a0) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x1a8) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x1a8) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x1b0) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x1b0) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x180) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x180) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x148) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x148) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x378) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x378) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x1d80) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x1d80) = 0;
  }
  if (*(long *)((long)pvVar1 + 0x1ae0) != 0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    *(undefined8 *)((long)pvVar1 + 0x1ae0) = 0;
  }
  if (ps_codec_obj->pv_codec_handle != (void *)0x0) {
    (**(code **)((long)pvVar1 + 0x3f50))(*(undefined8 *)((long)pvVar1 + 0x3f58));
    ps_codec_obj->pv_codec_handle = (void *)0x0;
  }
  (*pcVar2)(uVar3,ps_codec_obj);
  return 0;
}

Assistant:

WORD32 ihevcd_free_static_bufs(iv_obj_t *ps_codec_obj)
{
    codec_t *ps_codec;

    void (*pf_aligned_free)(void *pv_mem_ctxt, void *pv_buf);
    void *pv_mem_ctxt;

    ps_codec = (codec_t *)ps_codec_obj->pv_codec_handle;
    pf_aligned_free = ps_codec->pf_aligned_free;
    pv_mem_ctxt = ps_codec->pv_mem_ctxt;


    ALIGNED_FREE(ps_codec, ps_codec->apv_process_thread_handle[0]);
    ALIGNED_FREE(ps_codec, ps_codec->pu1_bitsbuf_static);

    ALIGNED_FREE(ps_codec, ps_codec->pv_disp_buf_mgr);
    ALIGNED_FREE(ps_codec, ps_codec->pv_dpb_mgr);
    ALIGNED_FREE(ps_codec, ps_codec->pv_pic_buf_mgr);
    ALIGNED_FREE(ps_codec, ps_codec->pv_mv_buf_mgr);
    ALIGNED_FREE(ps_codec, ps_codec->ps_vps_base);
    ALIGNED_FREE(ps_codec, ps_codec->ps_sps_base);
    ALIGNED_FREE(ps_codec, ps_codec->ps_pps_base);
    ALIGNED_FREE(ps_codec, ps_codec->ps_slice_hdr_base);
    ALIGNED_FREE(ps_codec, ps_codec->pi2_scaling_mat);
    ALIGNED_FREE(ps_codec, ps_codec->pv_pic_buf_base);
    ALIGNED_FREE(ps_codec, ps_codec->s_parse.pu1_luma_intra_pred_mode_left);
    ALIGNED_FREE(ps_codec, ps_codec->as_process[0].s_sao_ctxt.pu1_tmp_buf_luma);
    ALIGNED_FREE(ps_codec, ps_codec->as_process[0].pi2_inter_pred_tmp_buf1);
    ALIGNED_FREE(ps_codec, ps_codec_obj->pv_codec_handle);

    if(ps_codec_obj)
    {
        pf_aligned_free(pv_mem_ctxt, ps_codec_obj);
    }

    return IV_SUCCESS;

}